

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointLimitConstraint.cpp
# Opt level: O2

void __thiscall
btMultiBodyJointLimitConstraint::createConstraintRows
          (btMultiBodyJointLimitConstraint *this,btMultiBodyConstraintArray *constraintRows,
          btMultiBodyJacobianData *data,btContactSolverInfo *infoGlobal)

{
  btScalar *pbVar1;
  eFeatherstoneJointType eVar2;
  float *pfVar3;
  btMultibodyLink *pbVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  btMultiBodySolverConstraint *solverConstraint;
  long lVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  btScalar bVar15;
  float fVar16;
  float fVar17;
  btScalar bVar18;
  float fVar19;
  btVector3 bVar20;
  btQuadWord local_58;
  btVector3 local_48;
  
  if ((this->super_btMultiBodyConstraint).m_numDofsFinalized !=
      (this->super_btMultiBodyConstraint).m_jacSizeBoth) {
    (*(this->super_btMultiBodyConstraint)._vptr_btMultiBodyConstraint[2])(this);
  }
  bVar15 = btMultiBody::getJointPos
                     ((this->super_btMultiBodyConstraint).m_bodyA,
                      (this->super_btMultiBodyConstraint).m_linkA);
  (this->super_btMultiBodyConstraint).m_data.m_data[(this->super_btMultiBodyConstraint).m_posOffset]
       = bVar15 - this->m_lowerBound;
  fVar16 = this->m_upperBound;
  bVar15 = btMultiBody::getJointPos
                     ((this->super_btMultiBodyConstraint).m_bodyA,
                      (this->super_btMultiBodyConstraint).m_linkA);
  (this->super_btMultiBodyConstraint).m_data.m_data
  [(long)(this->super_btMultiBodyConstraint).m_posOffset + 1] = fVar16 - bVar15;
  for (lVar13 = 0; iVar12 = (int)lVar13, iVar12 < (this->super_btMultiBodyConstraint).m_numRows;
      lVar13 = lVar13 + 1) {
    fVar16 = (float)(int)(-(uint)(iVar12 != 0) | 1);
    solverConstraint =
         btAlignedObjectArray<btMultiBodySolverConstraint>::expandNonInitializing(constraintRows);
    solverConstraint->m_orgConstraint = &this->super_btMultiBodyConstraint;
    solverConstraint->m_orgDofIndex = iVar12;
    solverConstraint->m_multiBodyA = (this->super_btMultiBodyConstraint).m_bodyA;
    solverConstraint->m_multiBodyB = (this->super_btMultiBodyConstraint).m_bodyB;
    local_48.m_floats[0] = 0.0;
    local_48.m_floats[1] = 0.0;
    local_48.m_floats[2] = 0.0;
    local_48.m_floats[3] = 0.0;
    lVar11 = (long)iVar12 * (long)(this->super_btMultiBodyConstraint).m_jacSizeBoth +
             (long)(this->super_btMultiBodyConstraint).m_numRows;
    pfVar3 = (this->super_btMultiBodyConstraint).m_data.m_data;
    bVar15 = btMultiBodyConstraint::fillMultiBodyConstraint
                       (&this->super_btMultiBodyConstraint,solverConstraint,data,pfVar3 + lVar11,
                        pfVar3 + (long)(int)lVar11 +
                                 (long)(this->super_btMultiBodyConstraint).m_jacSizeA,&local_48,
                        &local_48,&local_48,0.0,infoGlobal,0.0,
                        (this->super_btMultiBodyConstraint).m_maxAppliedImpulse,1.0,false,0.0,0.0);
    iVar12 = (this->super_btMultiBodyConstraint).m_linkA;
    pbVar4 = (((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data;
    eVar2 = pbVar4[iVar12].m_jointType;
    if (eVar2 == ePrismatic) {
      local_58.m_floats =
           (btScalar  [4])btTransform::getRotation(&pbVar4[iVar12].m_cachedWorldTransform);
      bVar20 = quatRotate((btQuaternion *)&local_58,
                          &(((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data
                           [(this->super_btMultiBodyConstraint).m_linkA].m_axes[0].m_bottomVec);
      fVar17 = bVar20.m_floats[2] * fVar16;
      fVar19 = fVar16 * bVar20.m_floats[0];
      fVar16 = fVar16 * bVar20.m_floats[1];
      auVar8._4_4_ = fVar16;
      auVar8._0_4_ = fVar19;
      auVar8._8_4_ = fVar17;
      auVar8._12_4_ = 0;
      *(undefined1 (*) [16])(solverConstraint->m_contactNormal1).m_floats = auVar8;
      auVar10._8_4_ = -fVar17;
      auVar10._0_8_ = CONCAT44(fVar16,fVar19) ^ 0x8000000080000000;
      auVar10._12_4_ = 0;
      *(undefined1 (*) [16])(solverConstraint->m_contactNormal2).m_floats = auVar10;
      (solverConstraint->m_relpos1CrossNormal).m_floats[0] = 0.0;
      (solverConstraint->m_relpos1CrossNormal).m_floats[1] = 0.0;
      (solverConstraint->m_relpos1CrossNormal).m_floats[2] = 0.0;
      (solverConstraint->m_relpos1CrossNormal).m_floats[3] = 0.0;
      (solverConstraint->m_relpos2CrossNormal).m_floats[0] = 0.0;
      (solverConstraint->m_relpos2CrossNormal).m_floats[1] = 0.0;
      (solverConstraint->m_relpos2CrossNormal).m_floats[2] = 0.0;
      (solverConstraint->m_relpos2CrossNormal).m_floats[3] = 0.0;
    }
    else if (eVar2 == eRevolute) {
      (solverConstraint->m_contactNormal1).m_floats[0] = 0.0;
      (solverConstraint->m_contactNormal1).m_floats[1] = 0.0;
      (solverConstraint->m_contactNormal1).m_floats[2] = 0.0;
      (solverConstraint->m_contactNormal1).m_floats[3] = 0.0;
      (solverConstraint->m_contactNormal2).m_floats[0] = 0.0;
      (solverConstraint->m_contactNormal2).m_floats[1] = 0.0;
      (solverConstraint->m_contactNormal2).m_floats[2] = 0.0;
      (solverConstraint->m_contactNormal2).m_floats[3] = 0.0;
      local_58.m_floats =
           (btScalar  [4])
           btTransform::getRotation
                     (&(((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data
                       [(this->super_btMultiBodyConstraint).m_linkA].m_cachedWorldTransform);
      bVar20 = quatRotate((btQuaternion *)&local_58,
                          &(((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data
                           [(this->super_btMultiBodyConstraint).m_linkA].m_axes[0].m_topVec);
      fVar17 = bVar20.m_floats[2] * fVar16;
      fVar19 = fVar16 * bVar20.m_floats[0];
      fVar16 = fVar16 * bVar20.m_floats[1];
      auVar7._4_4_ = fVar16;
      auVar7._0_4_ = fVar19;
      auVar7._8_4_ = fVar17;
      auVar7._12_4_ = 0;
      *(undefined1 (*) [16])(solverConstraint->m_relpos1CrossNormal).m_floats = auVar7;
      auVar9._8_4_ = -fVar17;
      auVar9._0_8_ = CONCAT44(fVar16,fVar19) ^ 0x8000000080000000;
      auVar9._12_4_ = 0;
      *(undefined1 (*) [16])(solverConstraint->m_relpos2CrossNormal).m_floats = auVar9;
    }
    fVar16 = (this->super_btMultiBodyConstraint).m_data.m_data
             [(this->super_btMultiBodyConstraint).m_posOffset + lVar13];
    bVar14 = (infoGlobal->super_btContactSolverInfoData).m_splitImpulse != 0;
    pbVar1 = &(infoGlobal->super_btContactSolverInfoData).m_splitImpulsePenetrationThreshold;
    bVar5 = fVar16 == *pbVar1;
    bVar6 = fVar16 < *pbVar1;
    if (fVar16 <= 0.0) {
      fVar17 = -bVar15;
      fVar16 = (-fVar16 *
               (&(infoGlobal->super_btContactSolverInfoData).m_erp)[(bVar6 || bVar5) && bVar14]) /
               (infoGlobal->super_btContactSolverInfoData).m_timeStep;
    }
    else {
      fVar17 = -fVar16 / (infoGlobal->super_btContactSolverInfoData).m_timeStep;
      fVar16 = 0.0;
    }
    fVar16 = fVar16 * solverConstraint->m_jacDiagABInv;
    bVar15 = fVar17 * solverConstraint->m_jacDiagABInv;
    if (!bVar6 && !bVar5 || !bVar14) {
      bVar15 = bVar15 + fVar16;
    }
    bVar18 = 0.0;
    if ((bVar6 || bVar5) && bVar14) {
      bVar18 = fVar16;
    }
    solverConstraint->m_rhs = bVar15;
    solverConstraint->m_rhsPenetration = bVar18;
  }
  return;
}

Assistant:

void btMultiBodyJointLimitConstraint::createConstraintRows(btMultiBodyConstraintArray& constraintRows,
		btMultiBodyJacobianData& data,
		const btContactSolverInfo& infoGlobal)
{
	
    // only positions need to be updated -- data.m_jacobians and force
    // directions were set in the ctor and never change.

	if (m_numDofsFinalized != m_jacSizeBoth)
	{
        finalizeMultiDof();
	}


    // row 0: the lower bound
    setPosition(0, m_bodyA->getJointPos(m_linkA) - m_lowerBound);			//multidof: this is joint-type dependent

    // row 1: the upper bound
    setPosition(1, m_upperBound - m_bodyA->getJointPos(m_linkA));
	
	for (int row=0;row<getNumRows();row++)
	{
		
		btScalar direction = row? -1 : 1;

		btMultiBodySolverConstraint& constraintRow = constraintRows.expandNonInitializing();
        constraintRow.m_orgConstraint = this;
        constraintRow.m_orgDofIndex = row;
        
		constraintRow.m_multiBodyA = m_bodyA;
		constraintRow.m_multiBodyB = m_bodyB;
		const btScalar posError = 0;						//why assume it's zero?
		const btVector3 dummy(0, 0, 0);

		btScalar rel_vel = fillMultiBodyConstraint(constraintRow,data,jacobianA(row),jacobianB(row),dummy,dummy,dummy,posError,infoGlobal,0,m_maxAppliedImpulse);

		{
			//expect either prismatic or revolute joint type for now
			btAssert((m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::eRevolute)||(m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::ePrismatic));
			switch (m_bodyA->getLink(m_linkA).m_jointType)
			{
				case btMultibodyLink::eRevolute:
				{
					constraintRow.m_contactNormal1.setZero();
					constraintRow.m_contactNormal2.setZero();
					btVector3 revoluteAxisInWorld = direction*quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_topVec);
					constraintRow.m_relpos1CrossNormal=revoluteAxisInWorld;
					constraintRow.m_relpos2CrossNormal=-revoluteAxisInWorld;
					
					break;
				}
				case btMultibodyLink::ePrismatic:
				{
					btVector3 prismaticAxisInWorld = direction* quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_bottomVec);
					constraintRow.m_contactNormal1=prismaticAxisInWorld;
					constraintRow.m_contactNormal2=-prismaticAxisInWorld;
					constraintRow.m_relpos1CrossNormal.setZero();
					constraintRow.m_relpos2CrossNormal.setZero();
					
					break;
				}
				default:
				{
					btAssert(0);
				}
			};
			
		}

		{
			btScalar penetration = getPosition(row);
			btScalar positionalError = 0.f;
			btScalar	velocityError =  - rel_vel;// * damping;
			btScalar erp = infoGlobal.m_erp2;
			if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
			{
				erp = infoGlobal.m_erp;
			}
			if (penetration>0)
			{
				positionalError = 0;
				velocityError = -penetration / infoGlobal.m_timeStep;
			} else
			{
				positionalError = -penetration * erp/infoGlobal.m_timeStep;
			}

			btScalar  penetrationImpulse = positionalError*constraintRow.m_jacDiagABInv;
			btScalar velocityImpulse = velocityError *constraintRow.m_jacDiagABInv;
			if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
			{
				//combine position and velocity into rhs
				constraintRow.m_rhs = penetrationImpulse+velocityImpulse;
				constraintRow.m_rhsPenetration = 0.f;

			} else
			{
				//split position and velocity into rhs and m_rhsPenetration
				constraintRow.m_rhs = velocityImpulse;
				constraintRow.m_rhsPenetration = penetrationImpulse;
			}
		}
	}

}